

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restclient.cpp
# Opt level: O2

void __thiscall YdiskRestClient::move(YdiskRestClient *this,string *from,string *to,BOOL overwrite)

{
  undefined8 extraout_RAX;
  char *this_00;
  YdiskRestClient *this_01;
  Client *this_02;
  string empty_body;
  shared_ptr<httplib::Response> r;
  string url;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  undefined1 local_a0 [64];
  string local_60;
  string local_40;
  
  this_00 = "/v1/disk/resources/move?from=";
  std::__cxx11::string::string
            ((string *)(local_a0 + 0x20),"/v1/disk/resources/move?from=",(allocator *)&local_c0);
  url_encode(&local_40,(YdiskRestClient *)this_00,from);
  this_01 = (YdiskRestClient *)&local_40;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,
                 "&path=");
  url_encode(&local_60,this_01,to);
  std::operator+(&local_c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                 &local_60);
  std::__cxx11::string::append((string *)(local_a0 + 0x20));
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)local_a0);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::append(local_a0 + 0x20);
  std::__cxx11::string::append(local_a0 + 0x20);
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  local_c0._M_string_length = 0;
  local_c0.field_2._M_local_buf[0] = '\0';
  this_02 = (Client *)local_a0;
  httplib::Client::Post
            (this_02,(char *)this->http_client,(Headers *)local_a0._32_8_,(string *)&this->headers,
             (char *)&local_c0);
  if ((Response *)local_a0._0_8_ != (Response *)0x0) {
    if (*(int *)(local_a0._0_8_ + 0x20) != 0xc9) {
      if (*(int *)(local_a0._0_8_ + 0x20) != 0xca) goto LAB_00156685;
      wait_success_operation(this,(string *)(local_a0._0_8_ + 0x58));
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a0 + 8));
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)(local_a0 + 0x20));
    return;
  }
LAB_00156685:
  throw_response_error((YdiskRestClient *)this_02,(Response *)local_a0._0_8_);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)(local_a0 + 0x20));
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void YdiskRestClient::move(std::string from, std::string to, BOOL overwrite)
{
    std::string url("/v1/disk/resources/move?from=");
    url += url_encode(from) + "&path=" + url_encode(to);
    url += "&overwrite=";
    url += (overwrite == true ? "true": "false");
    std::string empty_body;
    auto r = http_client->Post(url.c_str(), headers, empty_body, "text/plain");

    if(r.get() && r->status==201){
        //success
        return;
    } else if(r.get() && r->status==202){
        //not empty folder is moving, get operation status
        wait_success_operation(r->body);
        return;
    } else {
        throw_response_error(r.get());
    }
}